

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fits_unencode_url(char *inpath,char *outpath,int *status)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  
  if (*status != 0) {
    return *status;
  }
LAB_001bcc8e:
  pcVar2 = inpath;
  cVar1 = *pcVar2;
  if (cVar1 == '%') goto code_r0x001bcc99;
  if (cVar1 == '\0') {
    *outpath = '\0';
    return *status;
  }
  inpath = pcVar2 + 1;
  *outpath = cVar1;
  goto LAB_001bcc88;
code_r0x001bcc99:
  cVar1 = pcVar2[1];
  inpath = pcVar2 + 1;
  if (cVar1 != '\0') {
    bVar3 = cVar1 - 0x30;
    if (9 < bVar3) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar3 = cVar1 - 0x37;
      }
      else {
        bVar3 = cVar1 + 0xa9;
      }
    }
    *outpath = bVar3 * '\x10';
    cVar1 = pcVar2[2];
    inpath = pcVar2 + 2;
    if (cVar1 != '\0') {
      bVar4 = cVar1 - 0x30;
      if (9 < bVar4) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar4 = cVar1 - 0x37;
        }
        else {
          bVar4 = cVar1 + 0xa9;
        }
      }
      *outpath = bVar4 + bVar3 * '\x10';
      inpath = pcVar2 + 3;
LAB_001bcc88:
      outpath = outpath + 1;
    }
  }
  goto LAB_001bcc8e;
}

Assistant:

int fits_unencode_url(char *inpath,  /* I input URL with encoding            */
		      char *outpath, /* O unencoded URL                      */
		      int  *status)
     /*
       unencode all URL "unsafe" and "reserved" characters to their actual
       ASCII representation. All tokens of the form "%XX" where XX is the
       hexidecimal code for an ASCII character, are searched for and
       translated into the actuall ASCII character (so three chars become
       1 char).

       It is assumed that OUTPATH has enough room to hold the unencoded
       URL.

       This function was adopted from code in the libwww.a library available
       via the W3 consortium <URL: http://www.w3.org>
     */

{
    char *p;
    char *q;
    char  c;

    if(*status != 0) return(*status);

    p = inpath;
    q = outpath;

    /* 
       loop over all characters in the inpath looking for the '%' escape
       character; if found the process the escape sequence
    */

    while(*p != 0) 
      {
	/* 
	   if the character is '%' then unencode the sequence, else
	   just copy the character from inpath to outpath
        */

        if (*p == HEX_ESCAPE)
	  {
            if((c = *(++p)) != 0)
	      { 
		*q = (
		      (c >= '0' && c <= '9') ?
		      (c - '0') : ((c >= 'A' && c <= 'F') ?
				   (c - 'A' + 10) : (c - 'a' + 10))
		      )*16;

		if((c = *(++p)) != 0)
		  {
		    *q = *q + (
			       (c >= '0' && c <= '9') ? 
		               (c - '0') : ((c >= 'A' && c <= 'F') ? 
					    (c - 'A' + 10) : (c - 'a' + 10))
			       );
		    p++, q++;
		  }
	      }
	  } 
	else
	  *q++ = *p++; 
      }
 
    /* terminate the outpath */
    *q = 0;

    return(*status);   
}